

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_y_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  uint16_t uVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint16_t *puVar14;
  ulong uVar15;
  ushort *puVar16;
  ushort *puVar17;
  ulong uVar18;
  ushort *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  
  cVar7 = (char)conv_params->round_0;
  bVar8 = (byte)conv_params->round_1;
  cVar6 = cVar7 + bVar8;
  cVar5 = (char)bd - cVar6;
  iVar24 = (1 << (cVar5 + 0xdU & 0x1f)) + (1 << (cVar5 + 0xeU & 0x1f));
  bVar12 = 0xe - cVar6;
  uVar1 = filter_params_y->taps;
  piVar3 = filter_params_y->filter_ptr;
  uVar22 = 0;
  uVar20 = (ulong)(uint)w;
  if (w < 1) {
    uVar20 = uVar22;
  }
  uVar21 = (ulong)(uint)h;
  if (h < 1) {
    uVar21 = 0;
  }
  lVar23 = (long)src_stride;
  puVar16 = src + (1 - (ulong)(uVar1 >> 1)) * lVar23;
  pCVar4 = conv_params->dst;
  iVar2 = conv_params->dst_stride;
  for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
    puVar17 = puVar16;
    for (uVar18 = 0; uVar18 != uVar20; uVar18 = uVar18 + 1) {
      iVar10 = 0;
      puVar19 = puVar17;
      for (uVar15 = 0; filter_params_y->taps != uVar15; uVar15 = uVar15 + 1) {
        iVar10 = iVar10 + (uint)*puVar19 *
                          (int)*(short *)((long)piVar3 +
                                         uVar15 * 2 +
                                         (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
        puVar19 = puVar19 + lVar23;
      }
      uVar11 = ((iVar10 << (7U - cVar7 & 0x1f)) + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f)) +
               iVar24;
      puVar14 = pCVar4 + uVar22 * (long)iVar2;
      if (conv_params->do_average != 0) {
        uVar13 = (uint)(pCVar4 + uVar22 * (long)iVar2)[uVar18];
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          iVar10 = (int)(uVar11 + uVar13) >> 1;
        }
        else {
          iVar10 = (int)(uVar11 * conv_params->bck_offset + uVar13 * conv_params->fwd_offset) >> 4;
        }
        uVar9 = clip_pixel_highbd(iVar10 + (((1 << (bVar12 & 0x1f)) >> 1) - iVar24) >>
                                  (bVar12 & 0x1f),bd);
        uVar11 = (uint)uVar9;
        puVar14 = dst + uVar22 * (long)dst_stride;
      }
      puVar14[uVar18] = (uint16_t)uVar11;
      puVar17 = puVar17 + 1;
    }
    puVar16 = puVar16 + lVar23;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_y,
                                      const int subpel_y_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      res *= (1 << bits);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_1) + round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}